

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O1

sgr * cpp_sgr::operator+(sgr *__return_storage_ptr__,sgr *left,sgr *right)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_60;
  long local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = (left->str)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (left->str)._M_string_length);
  std::__cxx11::string::append((char *)local_40);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_40,(ulong)(right->str)._M_dataplus._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_50 = *plVar4;
    uStack_48 = (undefined4)plVar3[3];
    uStack_44 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
    local_60 = (long *)*plVar3;
  }
  lVar2 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_60,lVar2 + (long)local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

sgr operator+(const sgr & left, const sgr & right)
		{
			return sgr(left.str + ";" + right.str);
		}